

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O2

bool cmAddSubDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  size_type sVar1;
  cmMakefile *this;
  bool bVar2;
  bool excludeFromAll;
  byte bVar3;
  bool bVar4;
  string *psVar5;
  string *psVar6;
  size_type __n;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string srcPath;
  string binPath;
  string binArg;
  string local_98;
  cmMakefile *local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  psVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&binArg,"called with incorrect number of arguments",
               (allocator<char> *)&srcPath);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&binArg);
    return false;
  }
  local_78 = status->Makefile;
  binArg._M_dataplus._M_p = (pointer)&binArg.field_2;
  binArg._M_string_length = 0;
  binArg.field_2._M_local_buf[0] = '\0';
  bVar3 = 0;
  excludeFromAll = false;
  __lhs = psVar5;
  while (__lhs = __lhs + 1, __lhs != psVar6) {
    bVar2 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      excludeFromAll = true;
    }
    else {
      bVar2 = std::operator==(__lhs,"SYSTEM");
      if (bVar2) {
        bVar3 = 1;
      }
      else {
        if (binArg._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcPath,"called with incorrect number of arguments",
                     (allocator<char> *)&binPath);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&srcPath);
          bVar2 = false;
          goto LAB_0024d82d;
        }
        std::__cxx11::string::_M_assign((string *)&binArg);
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&srcPath,"SYSTEM",(allocator<char> *)&binPath);
  this = local_78;
  bVar4 = cmMakefile::GetPropertyAsBool(local_78,&srcPath);
  std::__cxx11::string::~string((string *)&srcPath);
  srcPath._M_dataplus._M_p = (pointer)&srcPath.field_2;
  srcPath._M_string_length = 0;
  srcPath.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::FileIsFullPath(psVar5);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&srcPath);
  }
  else {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_98._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (&binPath,psVar6,(char *)&local_98,psVar5);
    std::__cxx11::string::operator=((string *)&srcPath,(string *)&binPath);
    std::__cxx11::string::~string((string *)&binPath);
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(&srcPath);
  if (!bVar2) {
    cmStrCat<char_const(&)[15],std::__cxx11::string_const&,char_const(&)[38]>
              (&binPath,(char (*) [15])"given source \"",psVar5,
               (char (*) [38])"\" which is not an existing directory.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&binPath);
    bVar2 = false;
    goto LAB_0024d823;
  }
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&binPath,&srcPath,psVar5);
  std::__cxx11::string::operator=((string *)&srcPath,(string *)&binPath);
  std::__cxx11::string::~string((string *)&binPath);
  binPath._M_dataplus._M_p = (pointer)&binPath.field_2;
  binPath._M_string_length = 0;
  binPath.field_2._M_local_buf[0] = '\0';
  if (binArg._M_string_length == 0) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&srcPath,psVar5);
    if (bVar2) {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      sVar1 = psVar5->_M_string_length;
      local_40._M_len = psVar6->_M_string_length;
      if (sVar1 == 0) {
        __pos = 0;
      }
      else {
        __pos = sVar1 - ((psVar5->_M_dataplus)._M_p[sVar1 - 1] == '/');
      }
      local_40._M_str = (psVar6->_M_dataplus)._M_p;
      if (local_40._M_len == 0) {
        __n = 0;
      }
      else {
        __n = local_40._M_len - (local_40._M_str[local_40._M_len - 1] == '/');
      }
      local_70 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,__n);
      local_60._M_len = srcPath._M_string_length;
      local_60._M_str = srcPath._M_dataplus._M_p;
      local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_60,__pos,0xffffffffffffffff);
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_98,&local_70,&local_50);
      goto LAB_0024d79e;
    }
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    cmStrCat<char_const(&)[51],char_const(&)[12],std::__cxx11::string&,char_const(&)[29],std::__cxx11::string_const&,char_const(&)[91]>
              (&local_98,(char (*) [51])"not given a binary directory but the given source ",
               (char (*) [12])0x6bfe19,&srcPath,(char (*) [29])"\" is not a subdirectory of \"",
               psVar5,(char (*) [91])
                      "\".  When specifying an out-of-tree source a binary directory must be explicitly specified."
              );
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_98);
    bVar2 = false;
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsFullPath(&binArg);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&binPath);
    }
    else {
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      local_70._M_len._0_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                (&local_98,psVar5,(char *)&local_70,&binArg);
LAB_0024d79e:
      std::__cxx11::string::operator=((string *)&binPath,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    cmsys::SystemTools::CollapseFullPath(&local_98,&binPath);
    std::__cxx11::string::operator=((string *)&binPath,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    bVar2 = true;
    cmMakefile::AddSubDirectory(this,&srcPath,&binPath,excludeFromAll,true,(bool)(bVar4 | bVar3));
  }
  std::__cxx11::string::~string((string *)&binPath);
LAB_0024d823:
  std::__cxx11::string::~string((string *)&srcPath);
LAB_0024d82d:
  std::__cxx11::string::~string((string *)&binArg);
  return bVar2;
}

Assistant:

bool cmAddSubDirectoryCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;
  bool system = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (arg == "SYSTEM") {
      system = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      status.SetError("called with incorrect number of arguments");
      return false;
    }
  }
  // "SYSTEM" directory property should also affects targets in nested
  // subdirectories.
  if (mf.GetPropertyAsBool("SYSTEM")) {
    system = true;
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = cmStrCat(mf.GetCurrentSourceDirectory(), '/', srcArg);
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = cmStrCat("given source \"", srcArg,
                                 "\" which is not an existing directory.");
    status.SetError(error);
    return false;
  }
  srcPath =
    cmSystemTools::CollapseFullPath(srcPath, mf.GetHomeOutputDirectory());

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(srcPath,
                                       mf.GetCurrentSourceDirectory())) {
      status.SetError(
        cmStrCat("not given a binary directory but the given source ",
                 "directory \"", srcPath, "\" is not a subdirectory of \"",
                 mf.GetCurrentSourceDirectory(),
                 "\".  When specifying an "
                 "out-of-tree source a binary directory must be explicitly "
                 "specified."));
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = mf.GetCurrentSourceDirectory();
    const std::string& bin = mf.GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = cmStrCat(cm::string_view(bin).substr(0, binLen),
                       cm::string_view(srcPath).substr(srcLen));
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', binArg);
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  mf.AddSubDirectory(srcPath, binPath, excludeFromAll, true, system);

  return true;
}